

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sls_8_aw(void)

{
  uint uVar1;
  uint value;
  
  uVar1 = m68ki_read_imm_16();
  value = 0;
  if (m68ki_cpu.not_z_flag == 0) {
    value = 0xff;
  }
  if (((ushort)m68ki_cpu.c_flag & 0x100) != 0) {
    value = 0xff;
  }
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,value);
  return;
}

Assistant:

static void m68k_op_sls_8_aw(void)
{
	m68ki_write_8(EA_AW_8(), COND_LS() ? 0xff : 0);
}